

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

Response * __thiscall
slack::_detail::Session::makeRequest(Response *__return_storage_ptr__,Session *this)

{
  CURLcode CVar1;
  char *pcVar2;
  ostream *poVar3;
  runtime_error *this_00;
  allocator local_f9;
  curl_header header;
  string error_msg;
  string response_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string header_string;
  undefined8 local_68 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::mutex::lock(&this->mutex_request_);
  header.curl_ = this->curl_;
  header.element = (curl_slist *)0x0;
  std::__cxx11::string::string
            ((string *)local_68,"Content-Type: application/x-www-form-urlencoded",
             (allocator *)&response_string);
  header.element = (curl_slist *)curl_slist_append(header.element,local_68[0]);
  std::__cxx11::string::~string((string *)local_68);
  curl_easy_setopt(this->curl_,0x2712,(this->url_)._M_dataplus._M_p);
  response_string._M_dataplus._M_p = (pointer)&response_string.field_2;
  response_string._M_string_length = 0;
  header_string._M_dataplus._M_p = (pointer)&header_string.field_2;
  header_string._M_string_length = 0;
  response_string.field_2._M_local_buf[0] = '\0';
  header_string.field_2._M_local_buf[0] = '\0';
  curl_easy_setopt(this->curl_,0x4e2b,writeFunction);
  curl_easy_setopt(this->curl_,0x2711,&response_string);
  curl_easy_setopt(this->curl_,0x272d,&header_string);
  CVar1 = curl_easy_perform(this->curl_);
  this->res_ = CVar1;
  error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
  error_msg._M_string_length = 0;
  error_msg.field_2._M_local_buf[0] = '\0';
  if (CVar1 != CURLE_OK) {
    pcVar2 = (char *)curl_easy_strerror(CVar1);
    std::__cxx11::string::string((string *)&local_a8,pcVar2,&local_f9);
    std::operator+(&local_48,"curl_easy_perform() failed ",&local_a8);
    std::__cxx11::string::operator=((string *)&error_msg,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_a8);
    if (this->throw_exception_ == true) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)&error_msg);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"[slacking] curl_easy_perform() failed ");
    poVar3 = std::operator<<(poVar3,(string *)&error_msg);
    std::operator<<(poVar3,'\n');
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&response_string);
  __return_storage_ptr__->is_error = CVar1 != CURLE_OK;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->error_message,(string *)&error_msg);
  std::__cxx11::string::~string((string *)&error_msg);
  std::__cxx11::string::~string((string *)&header_string);
  std::__cxx11::string::~string((string *)&response_string);
  curl_header::~curl_header(&header);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_request_);
  return __return_storage_ptr__;
}

Assistant:

inline
Response Session::makeRequest() {
    std::lock_guard<std::mutex> lock(mutex_request_);
    
    //------ set our custom set of headers
    // for  using incoming webhook it is mandatory to set 
    // "Content-Type: application/x-www-form-urlencoded" in header

    curl_header  header(curl_);
    header.append("Content-Type: application/x-www-form-urlencoded");
    
    //-------- set our custom set of headers------------------------------  

    curl_easy_setopt(curl_, CURLOPT_URL, url_.c_str());
    
    std::string response_string;
    std::string header_string;
    curl_easy_setopt(curl_, CURLOPT_WRITEFUNCTION, writeFunction);
    curl_easy_setopt(curl_, CURLOPT_WRITEDATA, &response_string);
    curl_easy_setopt(curl_, CURLOPT_HEADERDATA, &header_string);

    res_ = curl_easy_perform(curl_);

    bool is_error = false;
    std::string error_msg{};
    if(res_ != CURLE_OK) {
        is_error = true;
        error_msg = "curl_easy_perform() failed " + std::string{curl_easy_strerror(res_)};
        if (throw_exception_) 
            throw std::runtime_error(error_msg);
        else 
            std::cerr << "[slacking] curl_easy_perform() failed " << error_msg << '\n';
    }

    return { response_string, is_error, error_msg };
}